

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O0

void InitPresetArray(void)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int row;
  int j_2;
  int i_11;
  int col;
  int j_1;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int next_position;
  int num_of_can_get;
  int position;
  int j;
  int i;
  int in_stack_ffffffffffffff84;
  uint uVar4;
  int local_50;
  uint local_4c;
  int local_48;
  int local_44;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  for (local_4 = 0; local_4 < 0x100; local_4 = local_4 + 1) {
    for (local_8 = 0; local_8 < 10; local_8 = local_8 + 1) {
      HORSE_CAN_GET[local_4][local_8] = 0;
      HORSE_CAN_GET[local_4][local_8] = 0;
      BISHOP_CAN_GET[local_4][0][local_8] = 0;
      *(undefined4 *)((long)local_4 * 0x50 + 0x309da8 + (long)local_8 * 4) = 0;
      KING_CAN_GET[local_4][0][local_8] = 0;
      *(undefined4 *)((long)local_4 * 0x50 + 0x2fada8 + (long)local_8 * 4) = 0;
      BISHOP_EYE[local_4][0][local_8] = 0;
      *(undefined4 *)((long)local_4 * 0x50 + 0x30eda8 + (long)local_8 * 4) = 0;
      ADVISOR_CAN_GET[local_4][0][local_8] = 0;
      *(undefined4 *)((long)local_4 * 0x50 + 0x2ffda8 + (long)local_8 * 4) = 0;
      PAWN_CAN_GET[local_4][0][local_8] = 0;
      *(undefined4 *)((long)local_4 * 0x50 + 0x304da8 + (long)local_8 * 4) = 0;
    }
    if (""[local_4] == '\0') {
      BIT_ROW_MASK[local_4] = 0;
      BIT_ROW_MASK[local_4] = 0;
    }
    else {
      iVar2 = GetCol(local_4);
      iVar2 = RowBitOpration(iVar2 + -3);
      BIT_ROW_MASK[local_4] = (UINT16)(1 << ((byte)iVar2 & 0x1f));
      iVar2 = GetRow(local_4);
      iVar2 = ColBitOpration(iVar2 + -3);
      BIT_COL_MASK[local_4] = (UINT16)(1 << ((byte)iVar2 & 0x1f));
    }
  }
  local_c = 0x33;
  while (local_c != 0) {
    local_10 = 0;
    if ((LEGAL_POSITION[0][local_c] & 2) != 0) {
      for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
        if ((LEGAL_POSITION[0][local_c + KING_DIRECTION[local_18]] & 2) != 0) {
          KING_CAN_GET[local_c][0][local_10] = local_c + KING_DIRECTION[local_18];
          local_10 = local_10 + 1;
        }
      }
    }
    local_10 = 0;
    if ((LEGAL_POSITION[1][local_c] & 2) != 0) {
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        if ((LEGAL_POSITION[1][local_c + KING_DIRECTION[local_1c]] & 2) != 0) {
          *(int *)((long)local_c * 0x50 + 0x2fada8 + (long)local_10 * 4) =
               local_c + KING_DIRECTION[local_1c];
          local_10 = local_10 + 1;
        }
      }
    }
    local_10 = 0;
    if ((LEGAL_POSITION[0][local_c] & 4) != 0) {
      for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
        if ((LEGAL_POSITION[0][local_c + ADVISOR_DIRECTION[local_20]] & 4) != 0) {
          ADVISOR_CAN_GET[local_c][0][local_10] = local_c + ADVISOR_DIRECTION[local_20];
          local_10 = local_10 + 1;
        }
      }
    }
    local_10 = 0;
    if ((LEGAL_POSITION[1][local_c] & 4) != 0) {
      for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
        if ((LEGAL_POSITION[1][local_c + ADVISOR_DIRECTION[local_24]] & 4) != 0) {
          *(int *)((long)local_c * 0x50 + 0x2ffda8 + (long)local_10 * 4) =
               local_c + ADVISOR_DIRECTION[local_24];
          local_10 = local_10 + 1;
        }
      }
    }
    local_10 = 0;
    if ((LEGAL_POSITION[0][local_c] & 0x10) != 0) {
      for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
        if ((LEGAL_POSITION[0][local_c + BISHOP_DIRECTION[local_28]] & 0x10) != 0) {
          BISHOP_CAN_GET[local_c][0][local_10] = local_c + BISHOP_DIRECTION[local_28];
          BISHOP_EYE[local_c][0][local_10] = local_c + BISHOP_EYE_DIRECTION[local_28];
          local_10 = local_10 + 1;
        }
      }
    }
    local_10 = 0;
    if ((LEGAL_POSITION[1][local_c] & 0x10) != 0) {
      for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
        if ((LEGAL_POSITION[1][local_c + BISHOP_DIRECTION[local_2c]] & 0x10) != 0) {
          *(int *)((long)local_c * 0x50 + 0x309da8 + (long)local_10 * 4) =
               local_c + BISHOP_DIRECTION[local_2c];
          *(int *)((long)local_c * 0x50 + 0x30eda8 + (long)local_10 * 4) =
               local_c + BISHOP_EYE_DIRECTION[local_2c];
          local_10 = local_10 + 1;
        }
      }
    }
    local_10 = 0;
    if ((LEGAL_POSITION[0][local_c] & 1) != 0) {
      for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
        if ((LEGAL_POSITION[0][local_c + HORSE_DIRECTION[local_30]] & 1) != 0) {
          HORSE_CAN_GET[local_c][local_10] = local_c + HORSE_DIRECTION[local_30];
          HORSE_LEG[local_c][local_10] = local_c + HORSE_LEG_DIRECTION[local_30];
          local_10 = local_10 + 1;
        }
      }
    }
    local_10 = 0;
    if ((LEGAL_POSITION[0][local_c] & 8) != 0) {
      for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
        iVar2 = local_c + PAWN_DIRECTION[0][local_34];
        if ((LEGAL_POSITION[0][iVar2] & 8) != 0) {
          PAWN_CAN_GET[local_c][0][local_10] = iVar2;
          local_10 = local_10 + 1;
        }
      }
    }
    local_10 = 0;
    if ((LEGAL_POSITION[1][local_c] & 8) != 0) {
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        iVar2 = local_c + PAWN_DIRECTION[1][local_38];
        if ((LEGAL_POSITION[1][iVar2] & 8) != 0) {
          *(int *)((long)local_c * 0x50 + 0x304da8 + (long)local_10 * 4) = iVar2;
          local_10 = local_10 + 1;
        }
      }
    }
    local_c = NextBoardPosition(in_stack_ffffffffffffff84);
  }
  local_3c = 0;
  do {
    if (8 < local_3c) {
      local_48 = 0;
      do {
        if (9 < local_48) {
          return;
        }
        local_4c = 0;
LAB_0010df90:
        if ((int)local_4c < 0x400) {
          cVar1 = (char)local_48;
          *(char *)((long)local_48 * 0x2000 + 0x31cd85 + (long)(int)local_4c * 8) = cVar1 + '\x03';
          *(char *)((long)local_48 * 0x2000 + 0x31cd84 + (long)(int)local_4c * 8) = cVar1 + '\x03';
          *(UINT8 *)((long)local_48 * 0x2000 + 0x31cd81 + (long)(int)local_4c * 8) = cVar1 + '\x03';
          ROOK_CANNON_CAN_GET_COL[local_48][(int)local_4c].no_capture[0] = cVar1 + '\x03';
          *(char *)((long)local_48 * 0x2000 + 0x31cd83 + (long)(int)local_4c * 8) = cVar1 + '\x03';
          *(char *)((long)local_48 * 0x2000 + 0x31cd82 + (long)(int)local_4c * 8) = cVar1 + '\x03';
          *(char *)((long)local_48 * 0x2000 + 0x31cd87 + (long)(int)local_4c * 8) = cVar1 + '\x03';
          *(char *)((long)local_48 * 0x2000 + 0x31cd86 + (long)(int)local_4c * 8) = cVar1 + '\x03';
          *(undefined2 *)((long)local_48 * 0x2000 + 0x339d82 + (long)(int)local_4c * 8) = 0;
          ROOK_CANNON_CAN_GET_COL_MASK[local_48][(int)local_4c].no_capture = 0;
          *(undefined2 *)((long)local_48 * 0x2000 + 0x339d86 + (long)(int)local_4c * 8) = 0;
          *(undefined2 *)((long)local_48 * 0x2000 + 0x339d84 + (long)(int)local_4c * 8) = 0;
          iVar2 = local_48;
          while (local_50 = iVar2 + 1, local_50 < 10) {
            iVar3 = ColBitOpration(local_50);
            if ((local_4c & 1 << ((byte)iVar3 & 0x1f)) != 0) {
              *(char *)((long)local_48 * 0x2000 + 0x31cd82 + (long)(int)local_4c * 8) =
                   (char)local_50 + '\x03';
              iVar3 = ColBitOpration(local_50);
              *(ushort *)((long)local_48 * 0x2000 + 0x339d82 + (long)(int)local_4c * 8) =
                   *(ushort *)((long)local_48 * 0x2000 + 0x339d82 + (long)(int)local_4c * 8) |
                   (ushort)(1 << ((byte)iVar3 & 0x1f));
              break;
            }
            ROOK_CANNON_CAN_GET_COL[local_48][(int)local_4c].no_capture[0] = (char)local_50 + '\x03'
            ;
            iVar2 = ColBitOpration(local_50);
            ROOK_CANNON_CAN_GET_COL_MASK[local_48][(int)local_4c].no_capture =
                 ROOK_CANNON_CAN_GET_COL_MASK[local_48][(int)local_4c].no_capture |
                 (ushort)(1 << ((byte)iVar2 & 0x1f));
            iVar2 = local_50;
          }
          for (local_50 = iVar2 + 2; local_50 < 10; local_50 = local_50 + 1) {
            iVar2 = ColBitOpration(local_50);
            if ((local_4c & 1 << ((byte)iVar2 & 0x1f)) != 0) {
              *(char *)((long)local_48 * 0x2000 + 0x31cd84 + (long)(int)local_4c * 8) =
                   (char)local_50 + '\x03';
              iVar2 = ColBitOpration(local_50);
              *(ushort *)((long)local_48 * 0x2000 + 0x339d84 + (long)(int)local_4c * 8) =
                   *(ushort *)((long)local_48 * 0x2000 + 0x339d84 + (long)(int)local_4c * 8) |
                   (ushort)(1 << ((byte)iVar2 & 0x1f));
              break;
            }
          }
          do {
            local_50 = local_50 + 1;
            iVar2 = local_48;
            if (9 < local_50) goto LAB_0010e385;
            iVar3 = ColBitOpration(local_50);
          } while ((local_4c & 1 << ((byte)iVar3 & 0x1f)) == 0);
          *(char *)((long)local_48 * 0x2000 + 0x31cd86 + (long)(int)local_4c * 8) =
               (char)local_50 + '\x03';
          iVar3 = ColBitOpration(local_50);
          *(ushort *)((long)local_48 * 0x2000 + 0x339d86 + (long)(int)local_4c * 8) =
               *(ushort *)((long)local_48 * 0x2000 + 0x339d86 + (long)(int)local_4c * 8) |
               (ushort)(1 << ((byte)iVar3 & 0x1f));
LAB_0010e385:
          do {
            local_50 = iVar2 + -1;
            if (local_50 < 0) goto LAB_0010e481;
            iVar3 = ColBitOpration(local_50);
            if ((local_4c & 1 << ((byte)iVar3 & 0x1f)) != 0) {
              *(char *)((long)local_48 * 0x2000 + 0x31cd83 + (long)(int)local_4c * 8) =
                   (char)local_50 + '\x03';
              iVar3 = ColBitOpration(local_50);
              *(ushort *)((long)local_48 * 0x2000 + 0x339d82 + (long)(int)local_4c * 8) =
                   *(ushort *)((long)local_48 * 0x2000 + 0x339d82 + (long)(int)local_4c * 8) |
                   (ushort)(1 << ((byte)iVar3 & 0x1f));
              goto LAB_0010e481;
            }
            *(char *)((long)local_48 * 0x2000 + 0x31cd81 + (long)(int)local_4c * 8) =
                 (char)local_50 + '\x03';
            iVar2 = ColBitOpration(local_50);
            ROOK_CANNON_CAN_GET_COL_MASK[local_48][(int)local_4c].no_capture =
                 ROOK_CANNON_CAN_GET_COL_MASK[local_48][(int)local_4c].no_capture |
                 (ushort)(1 << ((byte)iVar2 & 0x1f));
            iVar2 = local_50;
          } while( true );
        }
        local_48 = local_48 + 1;
      } while( true );
    }
    local_40 = 0;
LAB_0010d908:
    if ((int)local_40 < 0x200) {
      cVar1 = (char)local_3c;
      *(char *)((long)local_3c * 0x1000 + 0x313d85 + (long)(int)local_40 * 8) = cVar1 + '\x03';
      *(char *)((long)local_3c * 0x1000 + 0x313d84 + (long)(int)local_40 * 8) = cVar1 + '\x03';
      *(UINT8 *)((long)local_3c * 0x1000 + 0x313d81 + (long)(int)local_40 * 8) = cVar1 + '\x03';
      ROOK_CANNON_CAN_GET_ROW[local_3c][(int)local_40].no_capture[0] = cVar1 + '\x03';
      *(char *)((long)local_3c * 0x1000 + 0x313d83 + (long)(int)local_40 * 8) = cVar1 + '\x03';
      *(char *)((long)local_3c * 0x1000 + 0x313d82 + (long)(int)local_40 * 8) = cVar1 + '\x03';
      *(char *)((long)local_3c * 0x1000 + 0x313d87 + (long)(int)local_40 * 8) = cVar1 + '\x03';
      *(char *)((long)local_3c * 0x1000 + 0x313d86 + (long)(int)local_40 * 8) = cVar1 + '\x03';
      *(undefined2 *)((long)local_3c * 0x1000 + 0x330d82 + (long)(int)local_40 * 8) = 0;
      ROOK_CANNON_CAN_GET_ROW_MASK[local_3c][(int)local_40].no_capture = 0;
      *(undefined2 *)((long)local_3c * 0x1000 + 0x330d86 + (long)(int)local_40 * 8) = 0;
      *(undefined2 *)((long)local_3c * 0x1000 + 0x330d84 + (long)(int)local_40 * 8) = 0;
      iVar2 = local_3c;
      while (local_44 = iVar2 + 1, local_44 < 9) {
        iVar3 = RowBitOpration(local_44);
        if ((local_40 & 1 << ((byte)iVar3 & 0x1f)) != 0) {
          *(char *)((long)local_3c * 0x1000 + 0x313d82 + (long)(int)local_40 * 8) =
               (char)local_44 + '\x03';
          iVar3 = RowBitOpration(local_44);
          *(ushort *)((long)local_3c * 0x1000 + 0x330d82 + (long)(int)local_40 * 8) =
               *(ushort *)((long)local_3c * 0x1000 + 0x330d82 + (long)(int)local_40 * 8) |
               (ushort)(1 << ((byte)iVar3 & 0x1f));
          break;
        }
        ROOK_CANNON_CAN_GET_ROW[local_3c][(int)local_40].no_capture[0] = (char)local_44 + '\x03';
        iVar2 = RowBitOpration(local_44);
        ROOK_CANNON_CAN_GET_ROW_MASK[local_3c][(int)local_40].no_capture =
             ROOK_CANNON_CAN_GET_ROW_MASK[local_3c][(int)local_40].no_capture |
             (ushort)(1 << ((byte)iVar2 & 0x1f));
        iVar2 = local_44;
      }
      for (local_44 = iVar2 + 2; local_44 < 9; local_44 = local_44 + 1) {
        iVar2 = RowBitOpration(local_44);
        if ((local_40 & 1 << ((byte)iVar2 & 0x1f)) != 0) {
          *(char *)((long)local_3c * 0x1000 + 0x313d84 + (long)(int)local_40 * 8) =
               (char)local_44 + '\x03';
          iVar2 = RowBitOpration(local_44);
          *(ushort *)((long)local_3c * 0x1000 + 0x330d84 + (long)(int)local_40 * 8) =
               *(ushort *)((long)local_3c * 0x1000 + 0x330d84 + (long)(int)local_40 * 8) |
               (ushort)(1 << ((byte)iVar2 & 0x1f));
          break;
        }
      }
      do {
        local_44 = local_44 + 1;
        iVar2 = local_3c;
        if (8 < local_44) goto LAB_0010dcfd;
        iVar3 = RowBitOpration(local_44);
      } while ((local_40 & 1 << ((byte)iVar3 & 0x1f)) == 0);
      *(char *)((long)local_3c * 0x1000 + 0x313d86 + (long)(int)local_40 * 8) =
           (char)local_44 + '\x03';
      iVar3 = RowBitOpration(local_44);
      *(ushort *)((long)local_3c * 0x1000 + 0x330d86 + (long)(int)local_40 * 8) =
           *(ushort *)((long)local_3c * 0x1000 + 0x330d86 + (long)(int)local_40 * 8) |
           (ushort)(1 << ((byte)iVar3 & 0x1f));
LAB_0010dcfd:
      do {
        local_44 = iVar2 + -1;
        if (local_44 < 0) goto LAB_0010ddf9;
        iVar3 = RowBitOpration(local_44);
        if ((local_40 & 1 << ((byte)iVar3 & 0x1f)) != 0) {
          *(char *)((long)local_3c * 0x1000 + 0x313d83 + (long)(int)local_40 * 8) =
               (char)local_44 + '\x03';
          iVar3 = RowBitOpration(local_44);
          *(ushort *)((long)local_3c * 0x1000 + 0x330d82 + (long)(int)local_40 * 8) =
               *(ushort *)((long)local_3c * 0x1000 + 0x330d82 + (long)(int)local_40 * 8) |
               (ushort)(1 << ((byte)iVar3 & 0x1f));
          goto LAB_0010ddf9;
        }
        *(char *)((long)local_3c * 0x1000 + 0x313d81 + (long)(int)local_40 * 8) =
             (char)local_44 + '\x03';
        iVar2 = RowBitOpration(local_44);
        ROOK_CANNON_CAN_GET_ROW_MASK[local_3c][(int)local_40].no_capture =
             ROOK_CANNON_CAN_GET_ROW_MASK[local_3c][(int)local_40].no_capture |
             (ushort)(1 << ((byte)iVar2 & 0x1f));
        iVar2 = local_44;
      } while( true );
    }
    local_3c = local_3c + 1;
  } while( true );
LAB_0010e481:
  for (local_50 = iVar2 + -2; -1 < local_50; local_50 = local_50 + -1) {
    uVar4 = local_4c;
    iVar2 = ColBitOpration(local_50);
    if ((uVar4 & 1 << ((byte)iVar2 & 0x1f)) != 0) {
      *(char *)((long)local_48 * 0x2000 + 0x31cd85 + (long)(int)local_4c * 8) =
           (char)local_50 + '\x03';
      iVar2 = ColBitOpration(local_50);
      *(ushort *)((long)local_48 * 0x2000 + 0x339d84 + (long)(int)local_4c * 8) =
           *(ushort *)((long)local_48 * 0x2000 + 0x339d84 + (long)(int)local_4c * 8) |
           (ushort)(1 << ((byte)iVar2 & 0x1f));
      break;
    }
  }
  do {
    local_50 = local_50 + -1;
    if (local_50 < 0) goto LAB_0010e5db;
    iVar2 = ColBitOpration(local_50);
  } while ((local_4c & 1 << ((byte)iVar2 & 0x1f)) == 0);
  *(char *)((long)local_48 * 0x2000 + 0x31cd87 + (long)(int)local_4c * 8) = (char)local_50 + '\x03';
  iVar2 = ColBitOpration(local_50);
  *(ushort *)((long)local_48 * 0x2000 + 0x339d86 + (long)(int)local_4c * 8) =
       *(ushort *)((long)local_48 * 0x2000 + 0x339d86 + (long)(int)local_4c * 8) |
       (ushort)(1 << ((byte)iVar2 & 0x1f));
LAB_0010e5db:
  local_4c = local_4c + 1;
  goto LAB_0010df90;
LAB_0010ddf9:
  for (local_44 = iVar2 + -2; -1 < local_44; local_44 = local_44 + -1) {
    iVar2 = RowBitOpration(local_44);
    if ((local_40 & 1 << ((byte)iVar2 & 0x1f)) != 0) {
      *(char *)((long)local_3c * 0x1000 + 0x313d85 + (long)(int)local_40 * 8) =
           (char)local_44 + '\x03';
      iVar2 = RowBitOpration(local_44);
      *(ushort *)((long)local_3c * 0x1000 + 0x330d84 + (long)(int)local_40 * 8) =
           *(ushort *)((long)local_3c * 0x1000 + 0x330d84 + (long)(int)local_40 * 8) |
           (ushort)(1 << ((byte)iVar2 & 0x1f));
      break;
    }
  }
  do {
    local_44 = local_44 + -1;
    if (local_44 < 0) goto LAB_0010df53;
    iVar2 = RowBitOpration(local_44);
  } while ((local_40 & 1 << ((byte)iVar2 & 0x1f)) == 0);
  *(char *)((long)local_3c * 0x1000 + 0x313d87 + (long)(int)local_40 * 8) = (char)local_44 + '\x03';
  iVar2 = RowBitOpration(local_44);
  *(ushort *)((long)local_3c * 0x1000 + 0x330d86 + (long)(int)local_40 * 8) =
       *(ushort *)((long)local_3c * 0x1000 + 0x330d86 + (long)(int)local_40 * 8) |
       (ushort)(1 << ((byte)iVar2 & 0x1f));
LAB_0010df53:
  local_40 = local_40 + 1;
  goto LAB_0010d908;
}

Assistant:

void InitPresetArray(){
    // 1. 初始化预置数组
    for(int i = 0; i < 256; i ++){
        // 1.1. 初始化其他预置数组
        for(int j = 0; j < 10; j ++){
            HORSE_CAN_GET[i][j] = 0;
            HORSE_CAN_GET[i][j] = 0;
            BISHOP_CAN_GET[i][0][j] = 0;
            BISHOP_CAN_GET[i][1][j] = 0;
            KING_CAN_GET[i][0][j] = 0;
            KING_CAN_GET[i][1][j] = 0;
            BISHOP_EYE[i][0][j] = 0;
            BISHOP_EYE[i][1][j] = 0;
            ADVISOR_CAN_GET[i][0][j] = 0;
            ADVISOR_CAN_GET[i][1][j] = 0;
            PAWN_CAN_GET[i][0][j] = 0;
            PAWN_CAN_GET[i][1][j] = 0;
        }

        // 1.2. 初始化位行位列屏蔽位
        if(ON_BOARD[i]){
            BIT_ROW_MASK[i] = 1 << RowBitOpration(GetCol(i) - 3);
            BIT_COL_MASK[i] = 1 << ColBitOpration(GetRow(i) - 3);
        }
        else{
            BIT_ROW_MASK[i] = 0;
            BIT_ROW_MASK[i] = 0;
        }
    }
    int position = BOARD_FIRST_POSITION;    // 初始位置为棋盘上的第一个位置

    // 2.循环棋盘上的每一个位置
    //   (备注： POSITION_MASK[7] = {2, 4, 16, 1, 1, 1, 8} 各子力的特征值 将士相车马炮卒)
    while(position != 0){
        int num_of_can_get = 0;             // 预生成着法的个数
        int next_position;                  // 着后的下一个位置

        // 2.1. 生成帅（红）的在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[0]){
            for(int i = 0; i < 4; i ++){
                next_position = position + KING_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[0]){
                    KING_CAN_GET[position][RED][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.2. 生成将（黑）在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[0]){
            for(int i = 0; i < 4; i ++){
                next_position = position + KING_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[0]){
                    KING_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        
        // 2.3. 生成仕(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[1]){
            for(int i = 0; i < 4; i ++){
                next_position = position + ADVISOR_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[1]){
                    ADVISOR_CAN_GET[position][RED][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.3. 生成士(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[1]){
            for(int i = 0; i < 4; i ++){
                next_position = position + ADVISOR_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[1]){
                    ADVISOR_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.4. 生成象(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[2]){
            for(int i = 0; i < 4; i ++){
                next_position = position + BISHOP_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[2]){
                    BISHOP_CAN_GET[position][RED][num_of_can_get] = next_position;
                    BISHOP_EYE[position][RED][num_of_can_get] = position + BISHOP_EYE_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.5. 生成象(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[2]){
            for(int i = 0; i < 4; i ++){
                next_position = position + BISHOP_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[2]){
                    BISHOP_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    BISHOP_EYE[position][BLACK][num_of_can_get] = position + BISHOP_EYE_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.6. 生成马在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[4]){
            for(int i = 0; i < 8; i ++){
                next_position = position + HORSE_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[4]){
                    HORSE_CAN_GET[position][num_of_can_get] = next_position;
                    HORSE_LEG[position][num_of_can_get] = position + HORSE_LEG_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.7. 生成兵(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[6]){
            for(int i = 0; i < 3; i ++){
                next_position = position + PAWN_DIRECTION[RED][i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[6]){
                    PAWN_CAN_GET[position][RED][num_of_can_get] = next_position; 
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.8. 生成兵(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[6]){
            for(int i = 0; i < 3; i ++){
                next_position = position + PAWN_DIRECTION[BLACK][i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[6]){
                    PAWN_CAN_GET[position][BLACK][num_of_can_get] = next_position; 
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        position = NextBoardPosition(position);
    }

    // 3.生成位行位列预置数组
    
    // 3.1. 循环一行中的每一列
    for(int i = 0; i < 9; i ++){
        // 循环一行中的每种状态(位置是否有棋子)
        for(int j = 0; j < (1 << 9); j ++){
            // 3.1.1 将着法初始化(用当前位置初始化)
            ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture = 0;
            int col;
            // 3.1.2 生成车炮右边的着法
            for(col = i + 1; col < 9; col ++){
                // 此状态下，该列没有棋子
                if((j & (1 << RowBitOpration(col))) == 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture |= (1 << RowBitOpration(col));
                }
                // 此状态下，该列有棋子,可生成吃子着法
                else{
                    ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col ++; col < 9; col ++){
                // 已经隔了一子，判断炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col ++; col < 9; col ++){
                // 已经隔了两子，判断超级炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            // 3.1.3 生成车炮左边的着法
            for(col = i - 1; col >= 0; col--){
                // 此状态下，该列没有棋子
                if((j & (1 << RowBitOpration(col))) == 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture |= (1 << RowBitOpration(col));
                }
                // 此状态下，该列有棋子,可生成吃子着法
                else{
                    ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col --; col >= 0; col --){
                // 已经隔了一子，判断炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col --; col >= 0; col --){
                // 已经隔了两子，判断超级炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
        }
    }
    // 3.2. 循环一列中的每一行
    for(int i = 0; i < 10; i ++){
        // 循环一列的每一个状态
        for(int j = 0; j < (1 << 10); j ++){
            // 3.2.1 着法初始化
            ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].no_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].no_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture = 0;
            // 3.2.2 生成车炮向下的着法 
            int row;
            for(row = i + 1; row < 10; row ++){
                // 当前状态下该行无棋子
                if((j & (1 << ColBitOpration(row))) == 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].no_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture |= (1 << ColBitOpration(row));
                }
                // 当前状态下该行有棋子
                else{
                    ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row ++; row < 10; row ++){
                // 隔了一子，生成炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row ++; row < 10; row ++){
                // 隔了两子，生成超级炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            // 3.2.3 生成车炮向上的着法
            for(row = i - 1; row >= 0; row --){
                // 当前状态下该行无棋子
                if((j & (1 << ColBitOpration(row))) == 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].no_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture |= (1 << ColBitOpration(row));
                }
                // 当前状态下该行有棋子
                else{
                    ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row --; row >= 0; row --){
                // 隔了一子，生成炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row --; row >= 0; row --){
                // 隔了两子，生成超级炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
        }
    }  
}